

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O0

bool deqp::gls::checkPixels(TestLog *log,ConstPixelBufferAccess *surface)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  MessageBuilder *pMVar4;
  byte local_35e;
  byte local_35d;
  bool local_35c;
  byte local_35b;
  bool local_35a;
  bool local_359;
  MessageBuilder local_350;
  MessageBuilder local_1c0;
  undefined1 local_3e;
  bool local_3d;
  undefined1 local_3c [6];
  bool isBlack;
  bool isWhite;
  IVec4 pixel;
  int x;
  int y;
  bool anyUnexpected;
  bool allBlack;
  bool allWhite;
  ConstPixelBufferAccess *surface_local;
  TestLog *log_local;
  
  x._3_1_ = 1;
  x._2_1_ = true;
  x._1_1_ = 0;
  for (pixel.m_data[3] = 0; iVar1 = pixel.m_data[3],
      iVar2 = tcu::ConstPixelBufferAccess::getHeight(surface), iVar1 < iVar2;
      pixel.m_data[3] = pixel.m_data[3] + 1) {
    for (pixel.m_data[2] = 0; iVar1 = pixel.m_data[2],
        iVar2 = tcu::ConstPixelBufferAccess::getWidth(surface), iVar1 < iVar2;
        pixel.m_data[2] = pixel.m_data[2] + 1) {
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_3c,(int)surface,pixel.m_data[2],pixel.m_data[3]);
      piVar3 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_3c,0);
      local_359 = false;
      if (*piVar3 == 0xff) {
        piVar3 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_3c,1);
        local_359 = false;
        if (*piVar3 == 0xff) {
          piVar3 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_3c,2);
          local_359 = *piVar3 == 0xff;
        }
      }
      local_3d = local_359;
      piVar3 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_3c,0);
      local_35a = false;
      if (*piVar3 == 0) {
        piVar3 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_3c,1);
        local_35a = false;
        if (*piVar3 == 0) {
          piVar3 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_3c,2);
          local_35a = *piVar3 == 0;
        }
      }
      local_3e = local_35a;
      local_35b = 0;
      if (x._3_1_ != 0) {
        local_35b = local_3d;
      }
      x._3_1_ = local_35b & 1;
      local_35c = false;
      if (x._2_1_ != false) {
        local_35c = local_35a;
      }
      x._2_1_ = local_35c;
      local_35d = 1;
      if (x._1_1_ == 0) {
        local_35e = 0;
        if ((local_3d & 1U) == 0) {
          local_35e = local_35a ^ 0xff;
        }
        local_35d = local_35e;
      }
      x._1_1_ = local_35d & 1;
    }
  }
  if (x._3_1_ == 0) {
    if (x._1_1_ == 0) {
      if (x._2_1_ == false) {
        tcu::TestLog::operator<<(&local_350,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (&local_350,
                            (char (*) [92])
                            "WARNING: got inconsistent results over the image, when all pixels should be the same color!"
                           );
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_350);
      }
    }
    else {
      tcu::TestLog::operator<<(&local_1c0,log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_1c0,
                          (char (*) [91])
                          "WARNING: expecting all rendered pixels to be white or black, but got other colors as well!"
                         );
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1c0);
    }
    log_local._7_1_ = false;
  }
  else {
    log_local._7_1_ = true;
  }
  return log_local._7_1_;
}

Assistant:

static bool checkPixels (tcu::TestLog& log, const tcu::ConstPixelBufferAccess& surface)
{
	bool	allWhite		= true;
	bool	allBlack		= true;
	bool	anyUnexpected	= false;

	for (int y = 0; y < surface.getHeight(); y++)
	{
		for (int x = 0; x < surface.getWidth(); x++)
		{
			const tcu::IVec4	pixel		 = surface.getPixelInt(x, y);
			// Note: we really do not want to involve alpha in the check comparison
			// \todo [2010-09-22 kalle] Do we know that alpha would be one? If yes, could use color constants white and black.
			const bool			isWhite		 = (pixel[0] == 255) && (pixel[1] == 255) && (pixel[2] == 255);
			const bool			isBlack		 = (pixel[0] ==   0) && (pixel[1] ==   0) && (pixel[2] ==   0);

			allWhite		= allWhite && isWhite;
			allBlack		= allBlack && isBlack;
			anyUnexpected	= anyUnexpected || (!isWhite && !isBlack);
		}
	}

	if (!allWhite)
	{
		if (anyUnexpected)
			log << TestLog::Message << "WARNING: expecting all rendered pixels to be white or black, but got other colors as well!" << TestLog::EndMessage;
		else if (!allBlack)
			log << TestLog::Message << "WARNING: got inconsistent results over the image, when all pixels should be the same color!" << TestLog::EndMessage;

		return false;
	}

	return true;
}